

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void PPrintJste(TidyDocImpl *doc,uint indent,Node *node)

{
  uint saveWrap_00;
  uint mode;
  uint saveWrap;
  Bool wrapAsp;
  TidyPrintImpl *pprint;
  Node *node_local;
  uint indent_local;
  TidyDocImpl *doc_local;
  
  saveWrap_00 = WrapOffCond(doc,(uint)(((int)(doc->config).value[0x5a].v != 0 ^ 0xffU) & 1));
  AddString(&doc->pprint,"<#");
  mode = 2;
  if ((int)(doc->config).value[0x5c].v != 0) {
    mode = 0x10;
  }
  PPrintText(doc,mode,indent,node);
  AddString(&doc->pprint,"#>");
  WrapOn(doc,saveWrap_00);
  return;
}

Assistant:

static void PPrintJste( TidyDocImpl* doc, uint indent, Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool wrapAsp = cfgBool( doc, TidyWrapAsp );
    uint saveWrap = WrapOffCond( doc, !wrapAsp  );

    AddString( pprint, "<#" );
    PPrintText( doc, (cfgBool(doc, TidyWrapJste) ? CDATA : COMMENT),
                indent, node );
    AddString( pprint, "#>" );

    /* PCondFlushLine( doc, indent ); */
    WrapOn( doc, saveWrap );
}